

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::SetTor(CNetAddr *this,string *addr)

{
  long lVar1;
  bool bVar2;
  uint8_t (*checksum) [2];
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> str;
  Span<const_unsigned_char> addr_pubkey;
  Span<const_unsigned_char> input_version;
  Span<const_unsigned_char> input_checksum;
  uint8_t calculated_checksum [2];
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (6 < addr->_M_string_length) {
    checksum = (uint8_t (*) [2])0xffffffffffffffff;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,addr,
               addr->_M_string_length - 6,0xffffffffffffffff);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &input,".onion");
    std::__cxx11::string::~string((string *)&input);
    if (bVar2) {
      input_checksum.m_size = (size_t)(addr->_M_dataplus)._M_p;
      input_checksum.m_data = (uchar *)addr->_M_string_length;
      bVar2 = false;
      str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&input_checksum,0,
                       (size_type)(input_checksum.m_data + -6));
      DecodeBase32(&input,str);
      if (input.
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._M_engaged == true) {
        if ((long)input.
                  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            input.
            super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_payload._0_8_ == 0x23) {
          input_checksum.m_size = 2;
          input_version.m_data =
               input.
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x22;
          input_version.m_size = 1;
          input_checksum.m_data =
               input.
               super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ._M_payload._M_value.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x20;
          bVar2 = std::ranges::__equal_fn::
                  operator()<Span<const_unsigned_char>_&,_const_unsigned_char_(&)[1],_std::ranges::equal_to,_std::identity,_std::identity>
                            ((__equal_fn *)&std::ranges::equal,&input_version,&torv3::VERSION);
          if (bVar2) {
            addr_pubkey.m_size = (size_t)calculated_checksum;
            addr_pubkey.m_data = (uchar *)0x20;
            torv3::Checksum((torv3 *)input.
                                     super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     ._M_payload._M_value.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,addr_pubkey,checksum)
            ;
            bVar2 = std::ranges::__equal_fn::
                    operator()<Span<const_unsigned_char>_&,_unsigned_char_(&)[2],_std::ranges::equal_to,_std::identity,_std::identity>
                              ((__equal_fn *)&std::ranges::equal,&input_checksum,calculated_checksum
                              );
            if (bVar2) {
              this->m_net = NET_ONION;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
                        (&this->m_addr,
                         input.
                         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         input.
                         super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x20);
            }
            goto LAB_00595b80;
          }
        }
        bVar2 = false;
      }
LAB_00595b80:
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&input);
      goto LAB_00595b8a;
    }
  }
  bVar2 = false;
LAB_00595b8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetTor(const std::string& addr)
{
    static const char* suffix{".onion"};
    static constexpr size_t suffix_len{6};

    if (addr.size() <= suffix_len || addr.substr(addr.size() - suffix_len) != suffix) {
        return false;
    }

    auto input = DecodeBase32(std::string_view{addr}.substr(0, addr.size() - suffix_len));

    if (!input) {
        return false;
    }

    if (input->size() == torv3::TOTAL_LEN) {
        Span<const uint8_t> input_pubkey{input->data(), ADDR_TORV3_SIZE};
        Span<const uint8_t> input_checksum{input->data() + ADDR_TORV3_SIZE, torv3::CHECKSUM_LEN};
        Span<const uint8_t> input_version{input->data() + ADDR_TORV3_SIZE + torv3::CHECKSUM_LEN, sizeof(torv3::VERSION)};

        if (!std::ranges::equal(input_version, torv3::VERSION)) {
            return false;
        }

        uint8_t calculated_checksum[torv3::CHECKSUM_LEN];
        torv3::Checksum(input_pubkey, calculated_checksum);

        if (!std::ranges::equal(input_checksum, calculated_checksum)) {
            return false;
        }

        m_net = NET_ONION;
        m_addr.assign(input_pubkey.begin(), input_pubkey.end());
        return true;
    }

    return false;
}